

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

unique_ptr<Catch::IStream> __thiscall Catch::makeStream(Catch *this,string *filename)

{
  byte *pbVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  undefined8 *puVar4;
  streambuf *this_00;
  DebugOutStream *temp;
  long *this_01;
  ReusableStringStream local_50;
  string local_40;
  
  if ((filename->_M_string_length != 0) && (bVar3 = std::operator==(filename,"-"), !bVar3)) {
    if (*(filename->_M_dataplus)._M_p != '%') {
      puVar4 = (undefined8 *)operator_new(0x208);
      *puVar4 = &PTR__FileStream_0022cc60;
      this_01 = puVar4 + 1;
      std::ofstream::ofstream(this_01);
      std::ofstream::open((char *)this_01,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
      if ((*(byte *)((long)puVar4 + *(long *)(*this_01 + -0x18) + 0x28) & 5) == 0) {
        pbVar1 = (byte *)((long)puVar4 + *(long *)(*this_01 + -0x18) + 0x21);
        *pbVar1 = *pbVar1 | 0x20;
        local_40._M_dataplus._M_p = (pointer)0x0;
        *(undefined8 **)this = puVar4;
        Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::FileStream>::~unique_ptr
                  ((unique_ptr<Catch::Detail::(anonymous_namespace)::FileStream> *)&local_40);
        return (unique_ptr<Catch::IStream>)(IStream *)this;
      }
      ReusableStringStream::ReusableStringStream(&local_50);
      std::operator<<(local_50.m_oss,"Unable to open file: \'");
      std::operator<<(local_50.m_oss,(string *)filename);
      std::operator<<(local_50.m_oss,'\'');
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_40);
    }
    bVar3 = std::operator==(filename,"%debug");
    if (bVar3) {
      puVar4 = (undefined8 *)operator_new(0x120);
      *puVar4 = &PTR__DebugOutStream_0022cb38;
      this_00 = (streambuf *)operator_new(0x148);
      std::streambuf::streambuf(this_00);
      *(undefined ***)this_00 = &PTR__StreamBufImpl_0022cb80;
      *(streambuf **)(this_00 + 0x28) = this_00 + 0x40;
      *(streambuf **)(this_00 + 0x20) = this_00 + 0x40;
      *(streambuf **)(this_00 + 0x30) = this_00 + 0x140;
      puVar4[1] = this_00;
      std::ostream::ostream(puVar4 + 2,this_00);
      local_40._M_dataplus._M_p = (pointer)0x0;
      *(undefined8 **)this = puVar4;
      Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::DebugOutStream>::~unique_ptr
                ((unique_ptr<Catch::Detail::(anonymous_namespace)::DebugOutStream> *)&local_40);
      return (unique_ptr<Catch::IStream>)(IStream *)this;
    }
    bVar3 = std::operator==(filename,"%stderr");
    if (bVar3) {
      puVar4 = (undefined8 *)operator_new(0x118);
      *puVar4 = &PTR__CerrStream_0022cc18;
      std::ostream::ostream(puVar4 + 1,*(streambuf **)(*(long *)(std::cerr + -0x18) + 0x231798));
      *(undefined8 **)this = puVar4;
      return (unique_ptr<Catch::IStream>)(IStream *)this;
    }
    bVar3 = std::operator==(filename,"%stdout");
    if (!bVar3) {
      ReusableStringStream::ReusableStringStream(&local_50);
      std::operator<<(local_50.m_oss,"Unrecognised stream: \'");
      std::operator<<(local_50.m_oss,(string *)filename);
      std::operator<<(local_50.m_oss,'\'');
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_40);
    }
  }
  Detail::make_unique<Catch::Detail::(anonymous_namespace)::CoutStream>();
  _Var2._M_p = local_40._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)0x0;
  *(pointer *)this = _Var2._M_p;
  Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream>::~unique_ptr
            ((unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream> *)&local_40);
  return (unique_ptr<Catch::IStream>)(IStream *)this;
}

Assistant:

auto makeStream( std::string const& filename ) -> Detail::unique_ptr<IStream> {
        if ( filename.empty() || filename == "-" ) {
            return Detail::make_unique<Detail::CoutStream>();
        }
        if( filename[0] == '%' ) {
            if ( filename == "%debug" ) {
                return Detail::make_unique<Detail::DebugOutStream>();
            } else if ( filename == "%stderr" ) {
                return Detail::make_unique<Detail::CerrStream>();
            } else if ( filename == "%stdout" ) {
                return Detail::make_unique<Detail::CoutStream>();
            } else {
                CATCH_ERROR( "Unrecognised stream: '" << filename << '\'' );
            }
        }
        return Detail::make_unique<Detail::FileStream>( filename );
    }